

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

bool __thiscall psy::C::Parser::ignoreDeclarationOrDefinition(Parser *this)

{
  SyntaxKind SVar1;
  SyntaxToken *this_00;
  Parser *this_local;
  
  do {
    this_00 = peek(this,1);
    SVar1 = SyntaxToken::kind(this_00);
    switch(SVar1) {
    case EndOfFile:
    case Keyword_auto:
    case Keyword_enum:
    case Keyword_extern:
    case KeywordAlias___inline:
    case Keyword_register:
    case Keyword_static:
    case Keyword_struct:
    case Keyword_typedef:
    case Keyword_union:
    case Keyword__Noreturn:
    case Keyword__Static_assert:
    case Keyword__Thread_local:
    case Keyword_ExtGNU___thread:
    case KeywordAlias___asm:
      return false;
    default:
      consume(this);
      break;
    case CloseBraceToken:
    case SemicolonToken:
      consume(this);
      return false;
    }
  } while( true );
}

Assistant:

bool Parser::ignoreDeclarationOrDefinition()
{
    while (true) {
        switch (peek().kind()) {
            // Just return.
            case SyntaxKind::EndOfFile:
            case SyntaxKind::Keyword_typedef:
            case SyntaxKind::Keyword_extern:
            case SyntaxKind::Keyword_static:
            case SyntaxKind::Keyword__Thread_local:
            case SyntaxKind::Keyword_ExtGNU___thread:
            case SyntaxKind::Keyword_auto:
            case SyntaxKind::Keyword_register:
            case SyntaxKind::Keyword_inline:
            case SyntaxKind::Keyword__Noreturn:
            case SyntaxKind::Keyword_struct:
            case SyntaxKind::Keyword_union:
            case SyntaxKind::Keyword_enum:
            case SyntaxKind::Keyword__Static_assert:
            case SyntaxKind::Keyword_ExtGNU___asm__:
                return false;

            // Skip and return.
            case SyntaxKind::SemicolonToken:
            case SyntaxKind::CloseBraceToken:
                consume();
                return false;

            // Skip.
            default:
                consume();
        }
    }
}